

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_manager.cpp
# Opt level: O1

void __thiscall cff::ColorManager::SetFgColor(ColorManager *this,Color col)

{
  char *pcVar1;
  
  switch(col) {
  case RESET:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
    return;
  case BLACK:
    pcVar1 = "\x1b[90m";
    break;
  case RED:
    pcVar1 = "\x1b[91m";
    break;
  case GREEN:
    pcVar1 = "\x1b[92m";
    break;
  case YELLOW:
    pcVar1 = "\x1b[93m";
    break;
  case BLUE:
    pcVar1 = "\x1b[94m";
    break;
  case MAGENTA:
    pcVar1 = "\x1b[95m";
    break;
  case CYAN:
    pcVar1 = "\x1b[96m";
    break;
  case WHITE:
    pcVar1 = "\x1b[97m";
    break;
  case BLACK_DARK:
    pcVar1 = "\x1b[30m";
    break;
  case RED_DARK:
    pcVar1 = "\x1b[31m";
    break;
  case GREEN_DARK:
    pcVar1 = "\x1b[32m";
    break;
  case YELLOW_DARK:
    pcVar1 = "\x1b[33m";
    break;
  case BLUE_DARK:
    pcVar1 = "\x1b[34m";
    break;
  case MAGENTA_DARK:
    pcVar1 = "\x1b[35m";
    break;
  case CYAN_DARK:
    pcVar1 = "\x1b[36m";
    break;
  case WHITE_DARK:
    pcVar1 = "\x1b[37m";
    break;
  default:
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,5);
  return;
}

Assistant:

void ColorManager::SetFgColor(Color col) {
        if(col == RESET) {
            std::cout << "\033[0m";
        } else if(col == BLACK) {
            std::cout << "\x1B[90m";
        } else if(col == RED) {
            std::cout << "\x1B[91m";
        } else if(col == GREEN) {
            std::cout << "\x1B[92m";
        } else if(col == YELLOW) {
            std::cout << "\x1B[93m";
        } else if(col == BLUE) {
            std::cout << "\x1B[94m";
        } else if(col == MAGENTA) {
            std::cout << "\x1B[95m";
        } else if(col == CYAN) {
            std::cout << "\x1B[96m";
        } else if(col == WHITE) {
            std::cout << "\x1B[97m";
        } else if(col == BLACK_DARK) {
            std::cout << "\x1B[30m";
        } else if(col == RED_DARK) {
            std::cout << "\x1B[31m";
        } else if(col == GREEN_DARK) {
            std::cout << "\x1B[32m";
        } else if(col == YELLOW_DARK) {
            std::cout << "\x1B[33m";
        } else if(col == BLUE_DARK) {
            std::cout << "\x1B[34m";
        } else if(col == MAGENTA_DARK) {
            std::cout << "\x1B[35m";
        } else if(col == CYAN_DARK) {
            std::cout << "\x1B[36m";
        } else if(col == WHITE_DARK) {
            std::cout << "\x1B[37m";
        }
    }